

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  bVar3 = (*(byte *)((long)*(long **)this + *(long *)(**(long **)this + -0x18) + 0x20) & 5) == 0;
  if ((bVar3 == (bool)((byte)this[9] & 1)) || (*(char *)(g_cs + 0x74) == '\x01')) {
    bVar3 = (bool)((bVar3 ^ (byte)this[9]) & 1);
    cVar1 = '\x14';
    pcVar2 = (char *)0x7d3f7b;
  }
  else {
    cVar1 = '\x17';
    bVar3 = true;
    pcVar2 = (char *)0x0;
  }
  __return_storage_ptr__->m_passed = bVar3;
  (__return_storage_ptr__->m_decomp).field_0.data.ptr = pcVar2;
  (__return_storage_ptr__->m_decomp).field_0.buf[0x17] = cVar1;
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only foc MSVC 2015:
// https://ci.appveyor.com/project/onqtam/doctest/builds/38181202
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                res = !res;

            if(!res || getContextOptions()->success)
                return Result(res, toString(lhs));
            return Result(res);
        }